

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMPSIO.cpp
# Opt level: O0

int readMPS_dense_cpp(char *filename,int mxNumRow,int mxNumCol,int *numRow_p,int *numCol_p,
                     int *objSense_p,double *objOffset_p,double **A_rw_p,double **rhs_p,
                     double **cost_p,double **lb_p,double **ub_p,int **integerColumn_p)

{
  int iVar1;
  pointer pdVar2;
  pointer piVar3;
  void *pvVar4;
  reference pvVar5;
  reference pvVar6;
  uint *in_RCX;
  vector<double,_std::allocator<double>_> *unaff_RBX;
  uint *in_R8;
  uint *in_R9;
  vector<double,_std::allocator<double>_> *unaff_retaddr;
  vector<double,_std::allocator<double>_> *in_stack_00000008;
  vector<double,_std::allocator<double>_> *in_stack_00000010;
  vector<double,_std::allocator<double>_> *in_stack_00000018;
  vector<int,_std::allocator<int>_> *in_stack_00000020;
  long *in_stack_00000028;
  long *in_stack_00000030;
  long *in_stack_00000038;
  int c_n;
  int r_n;
  int ix_n;
  int rtCd;
  vector<int,_std::allocator<int>_> integerColumn;
  vector<double,_std::allocator<double>_> ub;
  vector<double,_std::allocator<double>_> lb;
  vector<double,_std::allocator<double>_> cost;
  vector<double,_std::allocator<double>_> rhs;
  vector<double,_std::allocator<double>_> A_rw;
  double objOffset;
  int objSense;
  int numCol;
  int numRow;
  vector<double,_std::allocator<double>_> *this;
  int local_104;
  int local_100;
  int local_fc;
  vector<int,_std::allocator<int>_> local_e0;
  vector<double,_std::allocator<double>_> local_c8;
  vector<double,_std::allocator<double>_> local_b0;
  vector<double,_std::allocator<double>_> local_98;
  pointer in_stack_ffffffffffffff88;
  pointer in_stack_ffffffffffffff90;
  pointer in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  pointer in_stack_ffffffffffffffa8;
  pointer local_50;
  uint local_44;
  uint local_40;
  uint local_3c;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff4;
  
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x1c5410);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x1c5422);
  this = &local_98;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x1c5434);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x1c5446);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x1c5458);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x1c5468);
  iVar1 = readMPS_dense((char *)in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,
                        in_stack_ffffffffffffffa0,(int *)in_stack_ffffffffffffff98,
                        (int *)in_stack_ffffffffffffff90,(int *)in_stack_ffffffffffffff88,
                        (double *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),
                        unaff_RBX,unaff_retaddr,in_stack_00000008,in_stack_00000010,
                        in_stack_00000018,in_stack_00000020);
  if (iVar1 == 0) {
    *in_RCX = local_3c;
    *in_R8 = local_40;
    *in_R9 = local_44;
    (in_stack_00000008->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
    super__Vector_impl_data._M_start = local_50;
    printf("readMPS_dense_cpp: Model has %d rows and %d columns\n",(ulong)local_3c,(ulong)local_40);
    printf("readMPS_dense_cpp: Objective sense is %d; Objective offset is %g\n",local_50,
           (ulong)local_44);
    pdVar2 = (pointer)malloc((long)(int)local_3c * 8 * (long)(int)local_40);
    (in_stack_00000010->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
    super__Vector_impl_data._M_start = pdVar2;
    pdVar2 = (pointer)malloc((long)(int)local_3c << 3);
    (in_stack_00000018->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
    super__Vector_impl_data._M_start = pdVar2;
    piVar3 = (pointer)malloc((long)(int)local_40 << 3);
    (in_stack_00000020->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
    super__Vector_impl_data._M_start = piVar3;
    pvVar4 = malloc((long)(int)local_40 << 3);
    *in_stack_00000028 = (long)pvVar4;
    pvVar4 = malloc((long)(int)local_40 << 3);
    *in_stack_00000030 = (long)pvVar4;
    pvVar4 = malloc((long)(int)local_40 << 2);
    *in_stack_00000038 = (long)pvVar4;
    for (local_fc = 0; local_fc < (int)(local_3c * local_40); local_fc = local_fc + 1) {
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)&stack0xffffffffffffff98,
                          (long)local_fc);
      (in_stack_00000010->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
      super__Vector_impl_data._M_start[local_fc] = *pvVar5;
    }
    for (local_100 = 0; local_100 < (int)local_3c; local_100 = local_100 + 1) {
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)&stack0xffffffffffffff80,
                          (long)local_100);
      (in_stack_00000018->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
      super__Vector_impl_data._M_start[local_100] = *pvVar5;
    }
    for (local_104 = 0; local_104 < (int)local_40; local_104 = local_104 + 1) {
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](&local_98,(long)local_104);
      *(value_type *)
       ((in_stack_00000020->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
        super__Vector_impl_data._M_start + (long)local_104 * 2) = *pvVar5;
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](&local_b0,(long)local_104);
      *(value_type *)(*in_stack_00000028 + (long)local_104 * 8) = *pvVar5;
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](&local_c8,(long)local_104);
      *(value_type *)(*in_stack_00000030 + (long)local_104 * 8) = *pvVar5;
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&local_e0,(long)local_104);
      *(value_type *)(*in_stack_00000038 + (long)local_104 * 4) = *pvVar6;
    }
    iVar1 = 0;
  }
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)this);
  std::vector<double,_std::allocator<double>_>::~vector(this);
  std::vector<double,_std::allocator<double>_>::~vector(this);
  std::vector<double,_std::allocator<double>_>::~vector(this);
  std::vector<double,_std::allocator<double>_>::~vector(this);
  std::vector<double,_std::allocator<double>_>::~vector(this);
  return iVar1;
}

Assistant:

int readMPS_dense_cpp(const char *filename, int mxNumRow, int mxNumCol, 
		      int* numRow_p, int* numCol_p, int* objSense_p, double* objOffset_p,
		      double ** A_rw_p,
		      double ** rhs_p, double ** cost_p, double ** lb_p, double ** ub_p,
		      int** integerColumn_p) {
  int numRow, numCol, objSense;
  double objOffset;
  vector<double> A_rw, rhs, cost, lb, ub;
  vector<int> integerColumn;
  int rtCd = readMPS_dense(filename, mxNumRow, mxNumCol,
			   numRow, numCol, objSense, objOffset,
			   A_rw,
			   rhs, cost, lb, ub,
			   integerColumn);
  if (rtCd) return rtCd;
  (*numRow_p) = numRow;
  (*numCol_p) = numCol;
  (*objSense_p) = objSense;
  (*objOffset_p) = objOffset;
#ifdef JAJH_dev
    printf("readMPS_dense_cpp: Model has %d rows and %d columns\n", numRow, numCol);
    printf("readMPS_dense_cpp: Objective sense is %d; Objective offset is %g\n", objSense, objOffset);
#endif
  *A_rw_p = (double *) malloc(sizeof(double)*numRow*numCol);
  *rhs_p = (double *) malloc(sizeof(double)*numRow);
  *cost_p = (double *) malloc(sizeof(double)*numCol);
  *lb_p = (double *) malloc(sizeof(double)*numCol);
  *ub_p = (double *) malloc(sizeof(double)*numCol);
  *integerColumn_p = (int *) malloc(sizeof(int)*numCol);
  for (int ix_n=0; ix_n<numRow*numCol; ix_n++) {
    (*A_rw_p)[ix_n] = A_rw[ix_n];
  }
  for (int r_n=0; r_n<numRow; r_n++) {
    (*rhs_p)[r_n] = rhs[r_n];
  }
  for (int c_n=0; c_n<numCol; c_n++) {
    (*cost_p)[c_n] = cost[c_n];
    (*lb_p)[c_n] = lb[c_n];
    (*ub_p)[c_n] = ub[c_n];
    (*integerColumn_p)[c_n] = integerColumn[c_n];
  }
  return 0;
}